

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NVCtrl.c
# Opt level: O0

int XNVCTRLQueryValidTargetAttributeValues
              (Display *dpy,int target_type,int target_id,uint display_mask,uint attribute,
              NVCTRLAttributeValidValuesRec *values)

{
  int iVar1;
  undefined1 *puVar2;
  int exists;
  xnvCtrlQueryValidAttributeValuesReq *req;
  xnvCtrlQueryValidAttributeValuesReply rep;
  XExtDisplayInfo *info;
  NVCTRLAttributeValidValuesRec *values_local;
  uint attribute_local;
  uint display_mask_local;
  int target_id_local;
  int target_type_local;
  Display *dpy_local;
  
  attribute_local = target_id;
  display_mask_local = target_type;
  _target_id_local = dpy;
  rep._24_8_ = find_display(dpy);
  if (values == (NVCTRLAttributeValidValuesRec *)0x0) {
    dpy_local._4_4_ = 0;
  }
  else if (((XExtDisplayInfo *)rep._24_8_ == (XExtDisplayInfo *)0x0) ||
          (((XExtDisplayInfo *)rep._24_8_)->codes == (XExtCodes *)0x0)) {
    dpy_local._4_4_ = 0;
  }
  else if (((XExtDisplayInfo *)rep._24_8_ == (XExtDisplayInfo *)0x0) ||
          (((XExtDisplayInfo *)rep._24_8_)->codes == (XExtCodes *)0x0)) {
    XMissingExtension(_target_id_local,nvctrl_extension_name);
    dpy_local._4_4_ = 0;
  }
  else {
    XNVCTRLCheckTargetData
              (_target_id_local,(XExtDisplayInfo *)rep._24_8_,(int *)&display_mask_local,
               (int *)&attribute_local);
    if (_target_id_local->lock_fns != (_XLockPtrs *)0x0) {
      (*_target_id_local->lock_fns->lock_display)(_target_id_local);
    }
    puVar2 = (undefined1 *)_XGetRequest(_target_id_local,5,0x10);
    *puVar2 = (char)*(undefined4 *)(*(long *)(rep._24_8_ + 0x10) + 4);
    puVar2[1] = 5;
    *(short *)(puVar2 + 6) = (short)display_mask_local;
    *(short *)(puVar2 + 4) = (short)attribute_local;
    *(uint *)(puVar2 + 8) = display_mask;
    *(uint *)(puVar2 + 0xc) = attribute;
    iVar1 = _XReply(_target_id_local,&req,0,1);
    if (iVar1 == 0) {
      if (_target_id_local->lock_fns != (_XLockPtrs *)0x0) {
        (*_target_id_local->lock_fns->unlock_display)(_target_id_local);
      }
      if (_target_id_local->synchandler != (_func_int__XDisplay_ptr *)0x0) {
        (*_target_id_local->synchandler)(_target_id_local);
      }
      dpy_local._4_4_ = 0;
    }
    else {
      values->type = rep.length;
      if (rep.length == 4) {
        (values->u).range.min = rep.flags;
        (values->u).range.max = rep.attr_type;
      }
      if (rep.length == 5) {
        (values->u).range.min = rep.min;
      }
      values->permissions = rep.max;
      if (_target_id_local->lock_fns != (_XLockPtrs *)0x0) {
        (*_target_id_local->lock_fns->unlock_display)(_target_id_local);
      }
      if (_target_id_local->synchandler != (_func_int__XDisplay_ptr *)0x0) {
        (*_target_id_local->synchandler)(_target_id_local);
      }
      dpy_local._4_1_ = rep.type;
      dpy_local._5_1_ = rep.pad0;
      dpy_local._6_2_ = rep.sequenceNumber;
    }
  }
  return dpy_local._4_4_;
}

Assistant:

Bool XNVCTRLQueryValidTargetAttributeValues (
    Display *dpy,
    int target_type,
    int target_id,
    unsigned int display_mask,
    unsigned int attribute,                                 
    NVCTRLAttributeValidValuesRec *values
){
    XExtDisplayInfo *info = find_display (dpy);
    xnvCtrlQueryValidAttributeValuesReply rep;
    xnvCtrlQueryValidAttributeValuesReq   *req;
    Bool exists;
    
    if (!values) return False;

    if(!XextHasExtension(info))
        return False;

    XNVCTRLCheckExtension (dpy, info, False);
    XNVCTRLCheckTargetData(dpy, info, &target_type, &target_id);

    LockDisplay (dpy);
    GetReq (nvCtrlQueryValidAttributeValues, req);
    req->reqType = info->codes->major_opcode;
    req->nvReqType = X_nvCtrlQueryValidAttributeValues;
    req->target_type = target_type;
    req->target_id = target_id;
    req->display_mask = display_mask;
    req->attribute = attribute;
    if (!_XReply (dpy, (xReply *) &rep, 0, xTrue)) {
        UnlockDisplay (dpy);
        SyncHandle ();
        return False;
    }
    exists = rep.flags;
    values->type = rep.attr_type;
    if (rep.attr_type == ATTRIBUTE_TYPE_RANGE) {
        values->u.range.min = rep.min;
        values->u.range.max = rep.max;
    }
    if (rep.attr_type == ATTRIBUTE_TYPE_INT_BITS) {
        values->u.bits.ints = rep.bits;
    }
    values->permissions = rep.perms;
    UnlockDisplay (dpy);
    SyncHandle ();
    return exists;
}